

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall
dxil_spv::Converter::Impl::decorate_physical_offsets
          (Impl *this,Id struct_type_id,Vector<spv::Id> *type_ids)

{
  bool bVar1;
  uint num;
  reference puVar2;
  SizeAlignment SVar3;
  Builder *this_00;
  uint32_t local_50;
  uint32_t uStack_4c;
  SizeAlignment size_alignment;
  uint *type_id;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<spv::Id> *__range1;
  int member_index;
  uint32_t offset;
  Vector<spv::Id> *type_ids_local;
  Id struct_type_id_local;
  Impl *this_local;
  
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  __end1 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::begin(type_ids)
  ;
  type_id = (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::end
                              (type_ids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
                                *)&type_id);
    if (!bVar1) {
      return;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
             ::operator*(&__end1);
    SVar3 = get_physical_size_for_type(this,*puVar2);
    local_50 = SVar3.size;
    if (local_50 == 0) break;
    uStack_4c = SVar3.alignment;
    num = (__range1._4_4_ + uStack_4c) - 1 & (uStack_4c - 1 ^ 0xffffffff);
    this_00 = builder(this);
    spv::Builder::addMemberDecoration(this_00,struct_type_id,(uint)__range1,DecorationOffset,num);
    __range1._4_4_ = local_50 + num;
    __range1._0_4_ = (uint)__range1 + 1;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("size_alignment.size != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/dxil_converter.cpp"
                ,0xeb7,
                "void dxil_spv::Converter::Impl::decorate_physical_offsets(spv::Id, const Vector<spv::Id> &)"
               );
}

Assistant:

void Converter::Impl::decorate_physical_offsets(spv::Id struct_type_id, const Vector<spv::Id> &type_ids)
{
	uint32_t offset = 0;
	int member_index = 0;
	for (auto &type_id : type_ids)
	{
		// DXIL seems to imply scalar alignment for node payload.
		// It's simple and easy, so just roll with that.
		auto size_alignment = get_physical_size_for_type(type_id);
		assert(size_alignment.size != 0);
		offset = (offset + size_alignment.alignment - 1) & ~(size_alignment.alignment - 1);
		builder().addMemberDecoration(struct_type_id, member_index, spv::DecorationOffset, offset);
		offset += size_alignment.size;
		member_index++;
	}
}